

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_witness_stack_set_dummy(wally_tx_witness_stack *stack,size_t index,uint32_t flags)

{
  int iVar1;
  
  if (flags == 1) {
    iVar1 = wally_tx_witness_stack_set(stack,index,(uchar *)0x0,0);
    return iVar1;
  }
  if (flags != 2) {
    if (flags == 4) {
      iVar1 = wally_tx_witness_stack_set(stack,index,"",0x48);
      return iVar1;
    }
    return -2;
  }
  iVar1 = wally_tx_witness_stack_set(stack,index,"",0x49);
  return iVar1;
}

Assistant:

int wally_tx_witness_stack_set_dummy(struct wally_tx_witness_stack *stack,
                                     size_t index, uint32_t flags)
{
    const unsigned char *p = NULL;
    size_t len = 0;

    if (flags == WALLY_TX_DUMMY_SIG) {
        p = DUMMY_SIG;
        len = sizeof(DUMMY_SIG);
    } else if (flags == WALLY_TX_DUMMY_SIG_LOW_R) {
        p = DUMMY_SIG;
        len = sizeof(DUMMY_SIG) - 1; /* Low-R signatures are always at least 1 byte shorter */
    } else if (flags != WALLY_TX_DUMMY_NULL)
        return WALLY_EINVAL;
    return wally_tx_witness_stack_set(stack, index, p, len);
}